

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void * duckdb_je_arena_malloc_hard
                 (tsdn_t *tsdn,arena_t *arena,size_t size,szind_t ind,_Bool zero,_Bool slab)

{
  uint64_t *puVar1;
  pac_decay_stats_t *ppVar2;
  locked_u64_t *plVar3;
  uint64_t uVar4;
  _Bool _Var5;
  arena_t *arena_00;
  void *pvVar6;
  edata_t *slab_00;
  undefined1 delay_trigger;
  uint *binshard_p;
  ulong uVar7;
  uint local_4c;
  pthread_mutex_t *local_48;
  bin_info_t *local_40;
  size_t local_38;
  
  if (tsdn == (tsdn_t *)0x0) {
LAB_01f8185e:
    if (arena == (arena_t *)0x0) {
      return (void *)0x0;
    }
  }
  else if (arena == (arena_t *)0x0) {
    arena = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
    if (arena == (arena_t *)0x0) {
      arena = arena_choose(&tsdn->tsd,(arena_t *)0x0);
    }
    if (((arena->pa_shard).pac.duckdb_je_oversize_threshold.repr <= size) &&
       (arena->ind < duckdb_je_manual_arena_base)) {
      arena = duckdb_je_arena_choose_huge(&tsdn->tsd);
      goto LAB_01f8185e;
    }
  }
  local_38 = duckdb_je_sz_index2size_tab[ind];
  if (!slab) {
    pvVar6 = duckdb_je_large_malloc(tsdn,arena,local_38,zero);
    return pvVar6;
  }
  binshard_p = &local_4c;
  arena_00 = (arena_t *)duckdb_je_arena_bin_choose(tsdn,arena,ind,binshard_p);
  malloc_mutex_lock(tsdn,(malloc_mutex_t *)arena_00);
  pvVar6 = arena_bin_malloc_no_fresh_slab
                     ((tsdn_t *)arena,arena_00,(bin_t *)(ulong)ind,(szind_t)binshard_p);
  delay_trigger = SUB81(binshard_p,0);
  if (pvVar6 == (void *)0x0) {
    *(undefined1 *)&(arena_00->stats).mapped = 0;
    local_48 = (pthread_mutex_t *)&(arena_00->stats).internal;
    pthread_mutex_unlock(local_48);
    uVar7 = (ulong)local_4c;
    local_40 = duckdb_je_bin_infos + ind;
    slab_00 = arena_slab_alloc(tsdn,arena,ind,local_4c,duckdb_je_bin_infos + ind);
    malloc_mutex_lock(tsdn,(malloc_mutex_t *)arena_00);
    pvVar6 = arena_bin_malloc_no_fresh_slab
                       ((tsdn_t *)arena,arena_00,(bin_t *)(ulong)ind,(szind_t)uVar7);
    delay_trigger = (undefined1)uVar7;
    if (pvVar6 != (void *)0x0) goto LAB_01f81747;
    if (slab_00 == (edata_t *)0x0) {
      *(undefined1 *)&(arena_00->stats).mapped = 0;
      pthread_mutex_unlock(local_48);
      return (void *)0x0;
    }
    ppVar2 = &(arena_00->stats).pa_shard_stats.pac_stats.decay_muzzy;
    (ppVar2->npurge).val.repr = (ppVar2->npurge).val.repr + 1;
    plVar3 = &(arena_00->stats).pa_shard_stats.pac_stats.decay_muzzy.purged;
    (plVar3->val).repr = (plVar3->val).repr + 1;
    (arena_00->stats).mutex_prof_data[0].tot_wait_time.ns = (uint64_t)slab_00;
    pvVar6 = arena_slab_reg_alloc(slab_00,local_40);
  }
  slab_00 = (edata_t *)0x0;
LAB_01f81747:
  puVar1 = &(arena_00->stats).nflushes_large;
  *puVar1 = *puVar1 + 1;
  uVar4 = (arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr;
  (arena_00->stats).pa_shard_stats.edata_avail = (arena_00->stats).pa_shard_stats.edata_avail + 1;
  (arena_00->stats).pa_shard_stats.pac_stats.decay_dirty.npurge.val.repr = uVar4 + 1;
  *(undefined1 *)&(arena_00->stats).mapped = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&(arena_00->stats).internal);
  if (slab_00 != (edata_t *)0x0) {
    duckdb_je_arena_slab_dalloc(tsdn,arena,slab_00);
  }
  if (zero) {
    switchD_016d4fed::default(pvVar6,0,local_38);
  }
  if ((tsdn != (tsdn_t *)0x0) &&
     (_Var5 = ticker_geom_ticks(&(tsdn->tsd).
                                 cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                                ,&(tsdn->tsd).
                                  cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state,
                                (uint)('\0' < (tsdn->tsd).
                                              cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level
                                      ),(_Bool)delay_trigger), _Var5)) {
    duckdb_je_arena_decay(tsdn,arena,false,false);
  }
  return pvVar6;
}

Assistant:

void *
arena_malloc_hard(tsdn_t *tsdn, arena_t *arena, size_t size, szind_t ind,
    bool zero, bool slab) {
	assert(!tsdn_null(tsdn) || arena != NULL);

	if (likely(!tsdn_null(tsdn))) {
		arena = arena_choose_maybe_huge(tsdn_tsd(tsdn), arena, size);
	}
	if (unlikely(arena == NULL)) {
		return NULL;
	}

	if (likely(slab)) {
		assert(sz_can_use_slab(size));
		return arena_malloc_small(tsdn, arena, ind, zero);
	} else {
		return large_malloc(tsdn, arena, sz_index2size(ind), zero);
	}
}